

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

Ptr<Image> __thiscall
myvk::Image::Create(Image *this,Ptr<Device> *device,VkImageCreateInfo *create_info,
                   VmaAllocationCreateFlags allocation_flags,VmaMemoryUsage memory_usage,
                   vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                   *access_queues)

{
  _Rb_tree_header *__last;
  pointer psVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  VkFormat VVar4;
  undefined4 uVar5;
  element_type *peVar6;
  Image *pIVar7;
  VkResult VVar8;
  long lVar9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  shared_ptr<myvk::Queue> *i;
  pointer psVar12;
  VkImageCreateInfo *pVVar13;
  byte bVar14;
  Ptr<Image> PVar15;
  shared_ptr<myvk::Image> ret;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queue_families;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> queue_family_set;
  _func_int **local_128;
  element_type *peStack_120;
  uint32_t *local_110;
  long local_108;
  long local_100;
  Ptr<Device> *local_f8;
  Image *local_f0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_e8;
  VkImageCreateInfo local_b8;
  VmaAllocationCreateInfo local_60;
  
  bVar14 = 0;
  local_f0 = this;
  std::__shared_ptr<myvk::Image,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Image>>
            ((__shared_ptr<myvk::Image,(__gnu_cxx::_Lock_policy)2> *)&local_128,
             (allocator<myvk::Image> *)&local_b8);
  local_128[8] = (_func_int *)
                 (device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f8 = device;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 9),
             &(device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  *(VkImageUsageFlags *)(local_128 + 4) = create_info->usage;
  *(undefined8 *)((long)local_128 + 0x24) = *(undefined8 *)&create_info->extent;
  *(uint32_t *)((long)local_128 + 0x2c) = (create_info->extent).depth;
  VVar4 = create_info->format;
  uVar2 = create_info->mipLevels;
  uVar3 = create_info->arrayLayers;
  *(VkImageType *)(local_128 + 6) = create_info->imageType;
  *(VkFormat *)((long)local_128 + 0x34) = VVar4;
  *(uint32_t *)(local_128 + 7) = uVar2;
  *(uint32_t *)((long)local_128 + 0x3c) = uVar3;
  __last = &local_e8._M_impl.super__Rb_tree_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar12 = (access_queues->
            super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (access_queues->
           super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  if (psVar12 != psVar1) {
    do {
      local_b8.sType =
           ((((psVar12->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_unique_queue_ptr).super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_family_index;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(&local_e8,&local_b8.sType);
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar1);
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_110,
             (_Rb_tree_const_iterator<unsigned_int>)
             local_e8._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_int>)__last,(allocator_type *)&local_b8);
  pIVar7 = local_f0;
  pVVar13 = &local_b8;
  for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar5 = *(undefined4 *)&create_info->field_0x4;
    pVVar13->sType = create_info->sType;
    *(undefined4 *)&pVVar13->field_0x4 = uVar5;
    create_info = (VkImageCreateInfo *)((long)create_info + (ulong)bVar14 * -0x10 + 8);
    pVVar13 = (VkImageCreateInfo *)((long)pVVar13 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  uVar10 = local_108 - (long)local_110 >> 2;
  if (1 < uVar10) {
    local_b8.queueFamilyIndexCount = (uint32_t)uVar10;
    local_b8.pQueueFamilyIndices = local_110;
  }
  local_b8.sharingMode = (VkSharingMode)(1 < uVar10);
  local_60.pool = (VmaPool)0x0;
  local_60.pUserData = (void *)0x0;
  local_60.requiredFlags = 0;
  local_60.preferredFlags = 0;
  local_60.memoryTypeBits = 0;
  local_60._20_4_ = 0;
  local_60.priority = 0.0;
  local_60._44_4_ = 0;
  local_60.flags = allocation_flags;
  local_60.usage = memory_usage;
  VVar8 = vmaCreateImage(((local_f8->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_allocator,&local_b8,&local_60,(VkImage *)(local_128 + 3),
                         (VmaAllocation *)(local_128 + 10),(VmaAllocationInfo *)0x0);
  peVar6 = peStack_120;
  if (VVar8 == VK_SUCCESS) {
    peStack_120 = (element_type *)0x0;
    (pIVar7->super_ImageBase).super_DeviceObjectBase.super_Base._vptr_Base = local_128;
    (pIVar7->super_ImageBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
    local_128 = (_func_int **)0x0;
  }
  else {
    (pIVar7->super_ImageBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (pIVar7->super_ImageBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  if (local_110 != (uint32_t *)0x0) {
    operator_delete(local_110,local_100 - (long)local_110);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_e8);
  _Var11._M_pi = extraout_RDX;
  if (peStack_120 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_120);
    _Var11._M_pi = extraout_RDX_00;
  }
  PVar15.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  PVar15.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pIVar7;
  return (Ptr<Image>)PVar15.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Image> Image::Create(const Ptr<Device> &device, const VkImageCreateInfo &create_info,
                         VmaAllocationCreateFlags allocation_flags, VmaMemoryUsage memory_usage,
                         const std::vector<Ptr<Queue>> &access_queues) {
	auto ret = std::make_shared<Image>();
	ret->m_device_ptr = device;

	ret->m_usage = create_info.usage;
	ret->m_extent = create_info.extent;
	ret->m_type = create_info.imageType;
	ret->m_format = create_info.format;
	ret->m_mip_levels = create_info.mipLevels;
	ret->m_array_layers = create_info.arrayLayers;

	std::set<uint32_t> queue_family_set;
	for (auto &i : access_queues)
		queue_family_set.insert(i->GetFamilyIndex());
	std::vector<uint32_t> queue_families{queue_family_set.begin(), queue_family_set.end()};

	VkImageCreateInfo new_info{create_info};
	if (queue_families.size() <= 1) {
		new_info.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
	} else {
		new_info.sharingMode = VK_SHARING_MODE_CONCURRENT;
		new_info.queueFamilyIndexCount = queue_families.size();
		new_info.pQueueFamilyIndices = queue_families.data();
	}

	VmaAllocationCreateInfo alloc_info = {};
	alloc_info.flags = allocation_flags;
	alloc_info.usage = memory_usage;

	if (vmaCreateImage(device->GetAllocatorHandle(), &new_info, &alloc_info, &ret->m_image, &ret->m_allocation,
	                   nullptr) != VK_SUCCESS)
		return nullptr;
	return ret;
}